

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t unpack_16bit_3chan_interleave(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  exr_coding_channel_info_t *peVar3;
  void *pvVar4;
  int iVar5;
  int y;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint8_t *puVar10;
  long lVar11;
  ulong uVar12;
  uint8_t *puVar13;
  
  iVar5 = (decode->chunk).height - decode->user_line_end_ignore;
  iVar6 = decode->user_line_begin_skip;
  if (iVar6 < iVar5) {
    peVar3 = decode->channels;
    uVar1 = peVar3->width;
    pvVar4 = decode->unpacked_buffer;
    lVar8 = (long)(int)(uVar1 * 6);
    lVar7 = (long)(int)(uVar1 * 6 * iVar6);
    lVar9 = (long)pvVar4 + lVar7;
    puVar10 = (peVar3->field_12).decode_to_ptr;
    iVar2 = peVar3->user_line_stride;
    lVar11 = lVar7 + (long)(int)uVar1 * 4 + (long)pvVar4;
    lVar7 = lVar7 + (long)(int)uVar1 * 2 + (long)pvVar4;
    do {
      if (0 < (int)uVar1) {
        uVar12 = 0;
        puVar13 = puVar10;
        do {
          *(undefined2 *)puVar13 = *(undefined2 *)(lVar9 + uVar12 * 2);
          *(undefined2 *)(puVar13 + 2) = *(undefined2 *)(lVar7 + uVar12 * 2);
          *(undefined2 *)(puVar13 + 4) = *(undefined2 *)(lVar11 + uVar12 * 2);
          puVar13 = puVar13 + 6;
          uVar12 = uVar12 + 1;
        } while (uVar1 != uVar12);
      }
      lVar9 = lVar9 + lVar8;
      puVar10 = puVar10 + iVar2;
      iVar6 = iVar6 + 1;
      lVar11 = lVar11 + lVar8;
      lVar7 = lVar7 + lVar8;
    } while (iVar6 < iVar5);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_3chan_interleave (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += decode->user_line_begin_skip * w * 6;

    /* interleaving case, we can do this! */
    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        uint16_t* out = (uint16_t*) out0;

        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = one_to_native16 (in0[x]);
            out[1] = one_to_native16 (in1[x]);
            out[2] = one_to_native16 (in2[x]);
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}